

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O0

SweepResolutionFormulas __thiscall ON_Displacement::SweepResolutionFormula(ON_Displacement *this)

{
  ON_InternalXMLImpl *this_00;
  SweepResolutionFormulas SVar1;
  ON_XMLVariant local_208;
  ON_XMLVariant local_110;
  undefined4 local_14;
  int v;
  SweepResolutionFormulas def;
  ON_Displacement *this_local;
  
  local_14 = 0;
  this_00 = &((this->super_ON_MeshModifier).m_impl)->super_ON_InternalXMLImpl;
  _v = this;
  ::ON_XMLVariant::ON_XMLVariant(&local_208,0);
  ON_InternalXMLImpl::GetParameter(&local_110,this_00,L"sweep-res-formula",&local_208);
  SVar1 = ::ON_XMLVariant::AsInteger(&local_110);
  ::ON_XMLVariant::~ON_XMLVariant(&local_110);
  ::ON_XMLVariant::~ON_XMLVariant(&local_208);
  return SVar1;
}

Assistant:

ON_Displacement::SweepResolutionFormulas ON_Displacement::SweepResolutionFormula(void) const
{
  const auto def = SweepResolutionFormulas::Default;
  const int v = m_impl->GetParameter(ON_DISPLACEMENT_SWEEP_RES_FORMULA, int(def)).AsInteger();
  return SweepResolutionFormulas(v);
}